

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMem.c
# Opt level: O2

Aig_MmStep_t * Aig_MmStepStart(int nSteps)

{
  int iVar1;
  Aig_MmStep_t *pAVar2;
  Aig_MmFixed_t **ppAVar3;
  Aig_MmFixed_t *pAVar4;
  Aig_MmFixed_t **ppAVar5;
  char **ppcVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  pAVar2 = (Aig_MmStep_t *)calloc(1,0x30);
  pAVar2->nMems = nSteps;
  ppAVar3 = (Aig_MmFixed_t **)malloc((long)nSteps * 8);
  pAVar2->pMems = ppAVar3;
  uVar9 = 0;
  uVar8 = 0;
  if (0 < nSteps) {
    uVar8 = (ulong)(uint)nSteps;
  }
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    pAVar4 = Aig_MmFixedStart(8 << ((byte)uVar9 & 0x1f),0x2000);
    ppAVar3[uVar9] = pAVar4;
  }
  iVar1 = 4 << ((byte)nSteps & 0x1f);
  pAVar2->nMapSize = iVar1;
  ppAVar5 = (Aig_MmFixed_t **)malloc((long)(iVar1 + 1) << 3);
  *ppAVar5 = (Aig_MmFixed_t *)0x0;
  pAVar2->pMap = ppAVar5;
  pAVar4 = *ppAVar3;
  for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
    ppAVar5[lVar7 + 1] = pAVar4;
  }
  for (uVar9 = 0; uVar9 != uVar8; uVar9 = uVar9 + 1) {
    for (lVar7 = (long)((4 << ((byte)uVar9 & 0x1f)) + 1); lVar7 <= 8 << ((byte)uVar9 & 0x1f);
        lVar7 = lVar7 + 1) {
      ppAVar5[lVar7] = ppAVar3[uVar9];
    }
  }
  pAVar2->nChunksAlloc = 0x40;
  pAVar2->nChunks = 0;
  ppcVar6 = (char **)malloc(0x200);
  pAVar2->pChunks = ppcVar6;
  return pAVar2;
}

Assistant:

Aig_MmStep_t * Aig_MmStepStart( int nSteps )
{
    Aig_MmStep_t * p;
    int i, k;
    p = ABC_ALLOC( Aig_MmStep_t, 1 );
    memset( p, 0, sizeof(Aig_MmStep_t) );
    p->nMems = nSteps;
    // start the fixed memory managers
    p->pMems = ABC_ALLOC( Aig_MmFixed_t *, p->nMems );
    for ( i = 0; i < p->nMems; i++ )
        p->pMems[i] = Aig_MmFixedStart( (8<<i), (1<<13) );
    // set up the mapping of the required memory size into the corresponding manager
    p->nMapSize = (4<<p->nMems);
    p->pMap = ABC_ALLOC( Aig_MmFixed_t *, p->nMapSize+1 );
    p->pMap[0] = NULL;
    for ( k = 1; k <= 4; k++ )
        p->pMap[k] = p->pMems[0];
    for ( i = 0; i < p->nMems; i++ )
        for ( k = (4<<i)+1; k <= (8<<i); k++ )
            p->pMap[k] = p->pMems[i];
//for ( i = 1; i < 100; i ++ )
//printf( "%10d: size = %10d\n", i, p->pMap[i]->nEntrySize );
    p->nChunksAlloc  = 64;
    p->nChunks       = 0;
    p->pChunks       = ABC_ALLOC( char *, p->nChunksAlloc );
    return p;
}